

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O1

void __thiscall QFontCache::decreaseCache(QFontCache *this)

{
  EngineCache *this_00;
  QBasicTimer *pQVar1;
  EngineDataCache *this_01;
  _Base_ptr *key;
  uint uVar2;
  QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>
  *pQVar3;
  Data *pDVar4;
  QFontEngineData *this_02;
  int iVar5;
  int iVar6;
  uint uVar7;
  _Rb_tree_node_base *p_Var8;
  Node<QFontEngine_*,_int> *pNVar9;
  int *piVar10;
  QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>
  *pQVar11;
  const_iterator alast;
  const_iterator afirst;
  _Base_ptr p_Var12;
  iterator afirst_00;
  const_iterator alast_00;
  uint uVar13;
  _Rb_tree_node_base *p_Var14;
  _Rb_tree_header *p_Var15;
  int iVar16;
  long in_FS_OFFSET;
  QFontEngine *fontEngine;
  _Rb_tree_node_base *local_58;
  QFontEngine *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar11 = (this->engineDataCache).d.d.ptr;
  iVar16 = 0;
  if (pQVar11 ==
      (QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>
       *)0x0) {
    p_Var8 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var8 = (pQVar11->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  p_Var14 = &(pQVar11->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar11 ==
      (QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>
       *)0x0) {
    p_Var14 = (_Rb_tree_node_base *)0x0;
  }
  if (p_Var8 != p_Var14) {
    iVar16 = 0;
    do {
      iVar6 = iVar16 + 0x568;
      if ((p_Var8[4]._M_parent)->_M_color == _S_black) {
        iVar6 = iVar16;
      }
      iVar16 = iVar6;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != p_Var14);
  }
  pQVar3 = (this->engineCache).d.d.ptr;
  if (pQVar3 == (QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>
                 *)0x0) {
    p_Var8 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var8 = (pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  this_00 = &this->engineCache;
  p_Var14 = &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar3 == (QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>
                 *)0x0) {
    p_Var14 = (_Rb_tree_node_base *)0x0;
  }
  for (; p_Var8 != p_Var14; p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
    key = &p_Var8[4]._M_left;
    iVar6 = *(int *)((long)&(p_Var8[4]._M_left)->_M_parent + 4);
    pDVar4 = (this->engineCacheCount).d;
    if ((pDVar4 == (Data *)0x0) ||
       (pNVar9 = QHashPrivate::Data<QHashPrivate::Node<QFontEngine*,int>>::findNode<QFontEngine*>
                           ((Data<QHashPrivate::Node<QFontEngine*,int>> *)pDVar4,(QFontEngine **)key
                           ), pNVar9 == (Node<QFontEngine_*,_int> *)0x0)) {
      piVar10 = (int *)0x0;
    }
    else {
      piVar10 = &pNVar9->value;
    }
    if (piVar10 == (int *)0x0) {
      iVar5 = 0;
    }
    else {
      iVar5 = *piVar10;
    }
    if (iVar5 < iVar6) {
      uVar13 = *(uint *)&(*key)[5]._M_parent;
      pDVar4 = (this->engineCacheCount).d;
      if ((pDVar4 == (Data *)0x0) ||
         (pNVar9 = QHashPrivate::Data<QHashPrivate::Node<QFontEngine*,int>>::findNode<QFontEngine*>
                             ((Data<QHashPrivate::Node<QFontEngine*,int>> *)pDVar4,
                              (QFontEngine **)key), pNVar9 == (Node<QFontEngine_*,_int> *)0x0)) {
        piVar10 = (int *)0x0;
      }
      else {
        piVar10 = &pNVar9->value;
      }
      if (piVar10 == (int *)0x0) {
        uVar7 = 0;
      }
      else {
        uVar7 = *piVar10;
      }
      iVar16 = iVar16 + uVar13 / uVar7;
    }
  }
  pQVar3 = (this_00->d).d.ptr;
  iVar6 = 0x200;
  if (pQVar3 != (QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>
                 *)0x0) {
    iVar6 = (int)(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x200;
  }
  uVar7 = (uint)(iVar6 + iVar16) >> 10;
  uVar13 = this->max_cost >> 1;
  if (uVar13 <= uVar7) {
    uVar13 = uVar7;
  }
  uVar7 = 0x1000;
  if (0x1000 < uVar13) {
    uVar7 = uVar13;
  }
  if ((this->autoClean == true) && (uVar7 == this->max_cost)) {
    pQVar1 = &this->timer;
    if (this->fast == true) {
      if (pQVar1->m_id != Invalid) {
        QBasicTimer::start(pQVar1,300000000000,1,this);
        this->fast = false;
      }
      goto LAB_0048da65;
    }
    QBasicTimer::start(pQVar1,10000000000,1,this);
    this->fast = true;
  }
  this_01 = &this->engineDataCache;
  this->max_cost = uVar7;
  QMap<QFontDef,_QFontEngineData_*>::detach(this_01);
  afirst._M_node =
       (((this->engineDataCache).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  QMap<QFontDef,_QFontEngineData_*>::detach(this_01);
  pQVar11 = (this->engineDataCache).d.d.ptr;
  while ((_Rb_tree_header *)afirst._M_node != &(pQVar11->m)._M_t._M_impl.super__Rb_tree_header) {
    piVar10 = *(int **)((long)afirst._M_node + 0x88);
    if (*piVar10 == 1) {
      this->total_cost = this->total_cost - 1;
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      this_02 = *(QFontEngineData **)((long)afirst._M_node + 0x88);
      if (this_02 != (QFontEngineData *)0x0) {
        QFontEngineData::~QFontEngineData(this_02);
        operator_delete(this_02,0x568);
      }
      alast.i._M_node = (const_iterator)std::_Rb_tree_increment(afirst._M_node);
      afirst._M_node =
           (_Base_ptr)QMap<QFontDef,_QFontEngineData_*>::erase(this_01,afirst._M_node,alast);
    }
    else {
      afirst._M_node = (_Base_ptr)std::_Rb_tree_increment(afirst._M_node);
    }
    QMap<QFontDef,_QFontEngineData_*>::detach(this_01);
    pQVar11 = (this_01->d).d.ptr;
  }
  do {
    QMultiMap<QFontCache::Key,_QFontCache::Engine>::detach(this_00);
    p_Var12 = (((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    QMultiMap<QFontCache::Key,_QFontCache::Engine>::detach(this_00);
    p_Var15 = &(((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header;
    local_58 = &p_Var15->_M_header;
    if ((_Rb_tree_header *)p_Var12 != p_Var15) {
      uVar7 = 0xffffffff;
      uVar13 = 0xffffffff;
      do {
        iVar16 = *(int *)((long)&(p_Var12[4]._M_left)->_M_parent + 4);
        pDVar4 = (this->engineCacheCount).d;
        if ((pDVar4 == (Data *)0x0) ||
           (pNVar9 = QHashPrivate::Data<QHashPrivate::Node<QFontEngine*,int>>::
                     findNode<QFontEngine*>
                               ((Data<QHashPrivate::Node<QFontEngine*,int>> *)pDVar4,
                                (QFontEngine **)&p_Var12[4]._M_left),
           pNVar9 == (Node<QFontEngine_*,_int> *)0x0)) {
          piVar10 = (int *)0x0;
        }
        else {
          piVar10 = &pNVar9->value;
        }
        if (piVar10 == (int *)0x0) {
          iVar6 = 0;
        }
        else {
          iVar6 = *piVar10;
        }
        if (((iVar16 == iVar6) && (*(uint *)&p_Var12[4]._M_right < uVar13)) &&
           (uVar2 = *(uint *)((long)&p_Var12[4]._M_right + 4), uVar2 <= uVar7)) {
          uVar13 = *(uint *)&p_Var12[4]._M_right;
          uVar7 = uVar2;
          local_58 = p_Var12;
        }
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      } while ((_Rb_tree_header *)p_Var12 != p_Var15);
    }
    if ((_Rb_tree_header *)local_58 == p_Var15) break;
    local_40 = (QFontEngine *)local_58[4]._M_left;
    QMultiMap<QFontCache::Key,_QFontCache::Engine>::detach(this_00);
    afirst_00._M_node =
         (((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (QMultiMap<QFontCache::Key,_QFontCache::Engine>::detach(this_00),
          (_Rb_tree_header *)afirst_00._M_node !=
          &(((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
      if ((QFontEngine *)afirst_00._M_node[4]._M_left == local_40) {
        LOCK();
        (local_40->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (local_40->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        alast_00.i._M_node = (const_iterator)std::_Rb_tree_increment(afirst_00._M_node);
        afirst_00._M_node =
             (_Base_ptr)
             QMultiMap<QFontCache::Key,_QFontCache::Engine>::erase
                       (this_00,afirst_00._M_node,alast_00);
      }
      else {
        afirst_00._M_node = (_Base_ptr)std::_Rb_tree_increment(afirst_00._M_node);
      }
    }
    uVar7 = local_40->cache_cost + 0x200;
    uVar13 = uVar7 >> 10;
    if (uVar7 < 0x400) {
      uVar13 = 1;
    }
    this->total_cost = this->total_cost - uVar13;
    if (local_40 != (QFontEngine *)0x0) {
      (*local_40->_vptr_QFontEngine[1])();
    }
    QHash<QFontEngine*,int>::removeImpl<QFontEngine*>
              ((QHash<QFontEngine*,int> *)&this->engineCacheCount,&local_40);
  } while (this->max_cost < this->total_cost);
LAB_0048da65:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontCache::decreaseCache()
{
    // go through the cache and count up everything in use
    uint in_use_cost = 0;

    {
        FC_DEBUG("  SWEEP engine data:");

        // make sure the cost of each engine data is at least 1kb
        const uint engine_data_cost =
            sizeof(QFontEngineData) > 1024 ? sizeof(QFontEngineData) : 1024;

        EngineDataCache::ConstIterator it = engineDataCache.constBegin(),
                                      end = engineDataCache.constEnd();
        for (; it != end; ++it) {
            FC_DEBUG("    %p: ref %2d", it.value(), int(it.value()->ref.loadRelaxed()));

            if (it.value()->ref.loadRelaxed() != 1)
                in_use_cost += engine_data_cost;
        }
    }

    {
        FC_DEBUG("  SWEEP engine:");

        EngineCache::ConstIterator it = engineCache.constBegin(),
                                  end = engineCache.constEnd();
        for (; it != end; ++it) {
            FC_DEBUG("    %p: timestamp %4u hits %2u ref %2d/%2d, cost %u bytes",
                     it.value().data, it.value().timestamp, it.value().hits,
                     it.value().data->ref.loadRelaxed(), engineCacheCount.value(it.value().data),
                     it.value().data->cache_cost);

            if (it.value().data->ref.loadRelaxed() > engineCacheCount.value(it.value().data))
                in_use_cost += it.value().data->cache_cost / engineCacheCount.value(it.value().data);
        }

        // attempt to make up for rounding errors
        in_use_cost += engineCache.size();
    }

    in_use_cost = (in_use_cost + 512) / 1024; // cost is stored in kb

    /*
      calculate the new maximum cost for the cache

      NOTE: in_use_cost is *not* correct due to rounding errors in the
      above algorithm.  instead of worrying about getting the
      calculation correct, we are more interested in speed, and use
      in_use_cost as a floor for new_max_cost
    */
    uint new_max_cost = qMax(qMax(max_cost / 2, in_use_cost), min_cost);

    FC_DEBUG("  after sweep, in use %u kb, total %u kb, max %u kb, new max %u kb",
              in_use_cost, total_cost, max_cost, new_max_cost);

    if (autoClean) {
        if (new_max_cost == max_cost) {
            if (fast) {
                FC_DEBUG("  cannot shrink cache, slowing timer");

                if (timer.isActive()) {
                    timer.start(slow_timeout, this);
                fast = false;
            }

            return;
        } else if (! fast) {
            FC_DEBUG("  dropping into passing gear");

            timer.start(fast_timeout, this);
            fast = true;        }
        }
    }

    max_cost = new_max_cost;

    {
        FC_DEBUG("  CLEAN engine data:");

        // clean out all unused engine data
        EngineDataCache::Iterator it = engineDataCache.begin();
        while (it != engineDataCache.end()) {
            if (it.value()->ref.loadRelaxed() == 1) {
                FC_DEBUG("    %p", it.value());
                decreaseCost(sizeof(QFontEngineData));
                it.value()->ref.deref();
                delete it.value();
                it = engineDataCache.erase(it);
            } else {
                ++it;
            }
        }
    }

    FC_DEBUG("  CLEAN engine:");

    // clean out the engine cache just enough to get below our new max cost
    bool cost_decreased;
    do {
        cost_decreased = false;

        EngineCache::Iterator it = engineCache.begin(),
                             end = engineCache.end();
        // determine the oldest and least popular of the unused engines
        uint oldest = ~0u;
        uint least_popular = ~0u;

        EngineCache::Iterator jt = end;

        for ( ; it != end; ++it) {
            if (it.value().data->ref.loadRelaxed() != engineCacheCount.value(it.value().data))
                continue;

            if (it.value().timestamp < oldest && it.value().hits <= least_popular) {
                oldest = it.value().timestamp;
                least_popular = it.value().hits;
                jt = it;
            }
        }

        it = jt;
        if (it != end) {
            FC_DEBUG("    %p: timestamp %4u hits %2u ref %2d/%2d, type %d",
                     it.value().data, it.value().timestamp, it.value().hits,
                     it.value().data->ref.loadRelaxed(), engineCacheCount.value(it.value().data),
                     it.value().data->type());

            QFontEngine *fontEngine = it.value().data;
            // get rid of all occurrences
            it = engineCache.begin();
            while (it != engineCache.end()) {
                if (it.value().data == fontEngine) {
                    fontEngine->ref.deref();
                    it = engineCache.erase(it);
                } else {
                    ++it;
                }
            }
            // and delete the last occurrence
            Q_ASSERT(fontEngine->ref.loadRelaxed() == 0);
            decreaseCost(fontEngine->cache_cost);
            delete fontEngine;
            engineCacheCount.remove(fontEngine);

            cost_decreased = true;
        }
    } while (cost_decreased && total_cost > max_cost);
}